

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::android::testNoLayers(TestStatus *__return_storage_ptr__,Context *context)

{
  bool bVar1;
  qpTestResult code;
  TestContext *this;
  TestLog *log_00;
  PlatformInterface *vkp;
  InstanceInterface *vki;
  VkPhysicalDevice physicalDevice;
  pointer pVVar2;
  string local_1a8;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
  local_140;
  __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
  local_138;
  const_iterator layer_1;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> layers_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
  local_d0;
  __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
  local_c8;
  const_iterator layer;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> layers;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  ResultCollector results;
  TestLog *log;
  Context *context_local;
  
  this = Context::getTestContext(context);
  log_00 = tcu::TestContext::getLog(this);
  results.m_message.field_2._8_8_ = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_70,log_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  vkp = Context::getPlatformInterface(context);
  ::vk::enumerateInstanceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer,vkp);
  local_c8._M_current =
       (VkLayerProperties *)
       std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::begin
                 ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer);
  while( true ) {
    local_d0._M_current =
         (VkLayerProperties *)
         std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::end
                   ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_c8,&local_d0);
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"Instance layer enumerated: ",
               (allocator<char> *)
               ((long)&layers_1.
                       super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pVVar2 = __gnu_cxx::
             __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
             ::operator->(&local_c8);
    std::operator+(&local_f0,&local_110,pVVar2->layerName);
    tcu::ResultCollector::fail((ResultCollector *)local_70,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&layers_1.
                       super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    __gnu_cxx::
    __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
    ::operator++(&local_c8);
  }
  std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::~vector
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer);
  vki = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer_1,vki,
             physicalDevice);
  local_138._M_current =
       (VkLayerProperties *)
       std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::begin
                 ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer_1)
  ;
  while( true ) {
    local_140._M_current =
         (VkLayerProperties *)
         std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::end
                   ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
                    &layer_1);
    bVar1 = __gnu_cxx::operator!=(&local_138,&local_140);
    if (!bVar1) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"Device layer enumerated: ",&local_181);
    pVVar2 = __gnu_cxx::
             __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
             ::operator->(&local_138);
    std::operator+(&local_160,&local_180,pVVar2->layerName);
    tcu::ResultCollector::fail((ResultCollector *)local_70,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    __gnu_cxx::
    __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
    ::operator++(&local_138);
  }
  std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::~vector
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer_1);
  code = tcu::ResultCollector::getResult((ResultCollector *)local_70);
  tcu::ResultCollector::getMessage_abi_cxx11_(&local_1a8,(ResultCollector *)local_70);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testNoLayers (Context& context)
{
	TestLog&				log		= context.getTestContext().getLog();
	tcu::ResultCollector	results	(log);

	{
		const vector<VkLayerProperties>	layers	= enumerateInstanceLayerProperties(context.getPlatformInterface());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
			results.fail(string("Instance layer enumerated: ") + layer->layerName);
	}

	{
		const vector<VkLayerProperties>	layers	= enumerateDeviceLayerProperties(context.getInstanceInterface(), context.getPhysicalDevice());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
			results.fail(string("Device layer enumerated: ") + layer->layerName);
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}